

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TablePopBackgroundChannel(void)

{
  ImDrawListSplitter *unaff_retaddr;
  ImGuiTableColumn *column;
  ImGuiTable *table;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiTable *clip_rect;
  ImGuiWindow *window_00;
  ImGuiContext *draw_list;
  
  window_00 = GImGui->CurrentWindow;
  clip_rect = GImGui->CurrentTable;
  draw_list = GImGui;
  ImSpan<ImGuiTableColumn>::operator[](&clip_rect->Columns,clip_rect->CurrentColumn);
  SetWindowClipRectBeforeSetChannel(window_00,(ImRect *)clip_rect);
  ImDrawListSplitter::SetCurrentChannel
            (unaff_retaddr,(ImDrawList *)draw_list,(int)((ulong)window_00 >> 0x20));
  return;
}

Assistant:

void ImGui::TablePopBackgroundChannel()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiTable* table = g.CurrentTable;
    ImGuiTableColumn* column = &table->Columns[table->CurrentColumn];

    // Optimization: avoid PopClipRect() + SetCurrentChannel()
    SetWindowClipRectBeforeSetChannel(window, table->HostBackupInnerClipRect);
    table->DrawSplitter->SetCurrentChannel(window->DrawList, column->DrawChannelCurrent);
}